

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

bool __thiscall libcellml::Generator::GeneratorImpl::modifiedProfile(GeneratorImpl *this)

{
  bool bVar1;
  Profile PVar2;
  GeneratorProfilePtr *in_RDX;
  string profileContents;
  string sStack_48;
  string local_28;
  
  generatorProfileAsString_abi_cxx11_(&local_28,(libcellml *)&this->mProfile,in_RDX);
  PVar2 = GeneratorProfile::profile
                    ((this->mProfile).
                     super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (PVar2 == C) {
    sha1(&sStack_48,&local_28);
    bVar1 = std::operator!=(&sStack_48,C_GENERATOR_PROFILE_SHA1);
  }
  else {
    sha1(&sStack_48,&local_28);
    bVar1 = std::operator!=(&sStack_48,PYTHON_GENERATOR_PROFILE_SHA1);
  }
  std::__cxx11::string::~string((string *)&sStack_48);
  std::__cxx11::string::~string((string *)&local_28);
  return bVar1;
}

Assistant:

bool Generator::GeneratorImpl::modifiedProfile() const
{
    std::string profileContents = generatorProfileAsString(mProfile);

    return (mProfile->profile() == GeneratorProfile::Profile::C) ?
               sha1(profileContents) != C_GENERATOR_PROFILE_SHA1 :
               sha1(profileContents) != PYTHON_GENERATOR_PROFILE_SHA1;
}